

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool google::GetSectionHeaderByName(int fd,char *name,size_t name_len,Elf64_Shdr *out)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ssize_t n_read;
  size_t name_offset;
  char header_name [64];
  size_t section_header_offset;
  size_t i;
  size_t shstrtab_offset;
  Elf64_Shdr shstrtab;
  Elf64_Ehdr elf_header;
  Elf64_Shdr *out_local;
  size_t name_len_local;
  char *name_local;
  int fd_local;
  
  bVar1 = ReadFromOffsetExact(fd,&shstrtab.sh_entsize,0x40,0);
  if ((bVar1) &&
     (bVar1 = ReadFromOffsetExact(fd,&shstrtab_offset,0x40,
                                  elf_header.e_phoff +
                                  (ulong)elf_header.e_flags._2_2_ * (ulong)elf_header.e_phentsize),
     bVar1)) {
    for (section_header_offset = 0; section_header_offset < elf_header.e_ehsize;
        section_header_offset = section_header_offset + 1) {
      bVar1 = ReadFromOffsetExact(fd,out,0x40,
                                  elf_header.e_phoff +
                                  elf_header.e_flags._2_2_ * section_header_offset);
      if (!bVar1) {
        return false;
      }
      if (0x40 < name_len) {
        RawLog__(GLOG_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize.cc"
                 ,0x10e,
                 "Section name \'%s\' is too long (%zu); section will not be found (even if present)."
                 ,name,name_len);
        return false;
      }
      sVar3 = ReadFromOffset(fd,&name_offset,name_len,shstrtab.sh_addr + out->sh_name);
      if (sVar3 == 0xffffffffffffffff) {
        return false;
      }
      if ((sVar3 == name_len) && (iVar2 = memcmp(&name_offset,name,name_len), iVar2 == 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GetSectionHeaderByName(int fd, const char* name, size_t name_len,
                            ElfW(Shdr) * out) {
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return false;
  }

  ElfW(Shdr) shstrtab;
  size_t shstrtab_offset =
      (elf_header.e_shoff + static_cast<size_t>(elf_header.e_shentsize) *
                                static_cast<size_t>(elf_header.e_shstrndx));
  if (!ReadFromOffsetExact(fd, &shstrtab, sizeof(shstrtab), shstrtab_offset)) {
    return false;
  }

  for (size_t i = 0; i < elf_header.e_shnum; ++i) {
    size_t section_header_offset =
        (elf_header.e_shoff + elf_header.e_shentsize * i);
    if (!ReadFromOffsetExact(fd, out, sizeof(*out), section_header_offset)) {
      return false;
    }
    char header_name[kMaxSectionNameLen];
    if (sizeof(header_name) < name_len) {
      RAW_LOG(WARNING,
              "Section name '%s' is too long (%zu); "
              "section will not be found (even if present).",
              name, name_len);
      // No point in even trying.
      return false;
    }
    size_t name_offset = shstrtab.sh_offset + out->sh_name;
    ssize_t n_read = ReadFromOffset(fd, &header_name, name_len, name_offset);
    if (n_read == -1) {
      return false;
    } else if (static_cast<size_t>(n_read) != name_len) {
      // Short read -- name could be at end of file.
      continue;
    }
    if (memcmp(header_name, name, name_len) == 0) {
      return true;
    }
  }
  return false;
}